

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O2

void __thiscall
chrono::ChSystemDescriptor::WriteMatrixBlocks(ChSystemDescriptor *this,string *path,string *prefix)

{
  string filename;
  ChVectorDynamic<double> mdfric;
  ChVectorDynamic<double> mdb;
  ChVectorDynamic<double> mdf;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_1310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12d0;
  ChSparseMatrix mdE;
  ChSparseMatrix mdCq;
  ChSparseMatrix mdM;
  ChStreamOutAsciiFile file_fric;
  ChStreamOutAsciiFile file_b;
  ChStreamOutAsciiFile file_f;
  ChStreamOutAsciiFile file_E;
  ChStreamOutAsciiFile file_Cq;
  ChStreamOutAsciiFile file_M;
  
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  Eigen::SparseMatrix<double,_1,_int>::SparseMatrix(&mdM);
  Eigen::SparseMatrix<double,_1,_int>::SparseMatrix(&mdCq);
  Eigen::SparseMatrix<double,_1,_int>::SparseMatrix(&mdE);
  mdf.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  mdf.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  mdb.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  mdb.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  mdfric.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  mdfric.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (*this->_vptr_ChSystemDescriptor[0x1b])(this,&mdCq,&mdM,&mdE,&mdf,&mdb,&mdfric,0,0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_E,path,
                 "/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_Cq,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_E,prefix
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_M,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_Cq,
                 "_M.dat");
  std::__cxx11::string::operator=((string *)&filename,(string *)&file_M);
  std::__cxx11::string::~string((string *)&file_M);
  std::__cxx11::string::~string((string *)&file_Cq);
  std::__cxx11::string::~string((string *)&file_E);
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&file_M,filename._M_dataplus._M_p,_S_trunc);
  ChStreamOutAscii::SetNumFormat(&file_M.super_ChStreamOutAscii,"%.12g");
  StreamOUTsparseMatlabFormat(&mdM,&file_M.super_ChStreamOutAscii);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_f,path,
                 "/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_E,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_f,prefix
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_Cq,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_E,
                 "_Cq.dat");
  std::__cxx11::string::operator=((string *)&filename,(string *)&file_Cq);
  std::__cxx11::string::~string((string *)&file_Cq);
  std::__cxx11::string::~string((string *)&file_E);
  std::__cxx11::string::~string((string *)&file_f);
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&file_Cq,filename._M_dataplus._M_p,_S_trunc);
  ChStreamOutAscii::SetNumFormat(&file_Cq.super_ChStreamOutAscii,"%.12g");
  StreamOUTsparseMatlabFormat(&mdCq,&file_Cq.super_ChStreamOutAscii);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_b,path,
                 "/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_f,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_b,prefix
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_E,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_f,
                 "_E.dat");
  std::__cxx11::string::operator=((string *)&filename,(string *)&file_E);
  std::__cxx11::string::~string((string *)&file_E);
  std::__cxx11::string::~string((string *)&file_f);
  std::__cxx11::string::~string((string *)&file_b);
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&file_E,filename._M_dataplus._M_p,_S_trunc);
  ChStreamOutAscii::SetNumFormat(&file_E.super_ChStreamOutAscii,"%.12g");
  StreamOUTsparseMatlabFormat(&mdE,&file_E.super_ChStreamOutAscii);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_fric,
                 path,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_b,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_fric,
                 prefix);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_f,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_b,
                 "_f.dat");
  std::__cxx11::string::operator=((string *)&filename,(string *)&file_f);
  std::__cxx11::string::~string((string *)&file_f);
  std::__cxx11::string::~string((string *)&file_b);
  std::__cxx11::string::~string((string *)&file_fric);
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&file_f,filename._M_dataplus._M_p,_S_trunc);
  ChStreamOutAscii::SetNumFormat(&file_f.super_ChStreamOutAscii,"%.12g");
  Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&file_b,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mdf,(type *)0x0);
  StreamOUTdenseMatlabFormat((ChMatrixConstRef)&file_b,&file_f.super_ChStreamOutAscii);
  Eigen::internal::handmade_aligned_free((void *)file_b.super_ChStreamFile._40_8_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1310,
                 path,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_fric,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1310,
                 prefix);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_b,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_fric,
                 "_b.dat");
  std::__cxx11::string::operator=((string *)&filename,(string *)&file_b);
  std::__cxx11::string::~string((string *)&file_b);
  std::__cxx11::string::~string((string *)&file_fric);
  std::__cxx11::string::~string((string *)&local_1310);
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&file_b,filename._M_dataplus._M_p,_S_trunc);
  ChStreamOutAscii::SetNumFormat(&file_b.super_ChStreamOutAscii,"%.12g");
  Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&file_fric,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mdb,(type *)0x0);
  StreamOUTdenseMatlabFormat((ChMatrixConstRef)&file_fric,&file_b.super_ChStreamOutAscii);
  Eigen::internal::handmade_aligned_free((void *)file_fric.super_ChStreamFile._40_8_);
  std::operator+(&local_12d0,path,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1310,
                 &local_12d0,prefix);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_fric,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1310,
                 "_fric.dat");
  std::__cxx11::string::operator=((string *)&filename,(string *)&file_fric);
  std::__cxx11::string::~string((string *)&file_fric);
  std::__cxx11::string::~string((string *)&local_1310);
  std::__cxx11::string::~string((string *)&local_12d0);
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&file_fric,filename._M_dataplus._M_p,_S_trunc);
  ChStreamOutAscii::SetNumFormat(&file_fric.super_ChStreamOutAscii,"%.12g");
  Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_1310,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mdfric,(type *)0x0);
  StreamOUTdenseMatlabFormat(&local_1310,&file_fric.super_ChStreamOutAscii);
  Eigen::internal::handmade_aligned_free
            (local_1310.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_data);
  ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file_fric);
  ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file_b);
  ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file_f);
  ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file_E);
  ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file_Cq);
  ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file_M);
  Eigen::internal::handmade_aligned_free
            (mdfric.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
  ;
  Eigen::internal::handmade_aligned_free
            (mdb.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (mdf.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::SparseMatrix<double,_1,_int>::~SparseMatrix(&mdE);
  Eigen::SparseMatrix<double,_1,_int>::~SparseMatrix(&mdCq);
  Eigen::SparseMatrix<double,_1,_int>::~SparseMatrix(&mdM);
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void ChSystemDescriptor::WriteMatrixBlocks(const std::string& path, const std::string& prefix) {
    const char* numformat = "%.12g";
    std::string filename;

    ChSparseMatrix mdM;
    ChSparseMatrix mdCq;
    ChSparseMatrix mdE;
    ChVectorDynamic<double> mdf;
    ChVectorDynamic<double> mdb;
    ChVectorDynamic<double> mdfric;
    ConvertToMatrixForm(&mdCq, &mdM, &mdE, &mdf, &mdb, &mdfric);

    filename = path + "/" + prefix + "_M.dat";
    ChStreamOutAsciiFile file_M(filename.c_str());
    file_M.SetNumFormat(numformat);
    StreamOUTsparseMatlabFormat(mdM, file_M);

    filename = path + "/" + prefix + "_Cq.dat";
    ChStreamOutAsciiFile file_Cq(filename.c_str());
    file_Cq.SetNumFormat(numformat);
    StreamOUTsparseMatlabFormat(mdCq, file_Cq);

    filename = path + "/" + prefix + "_E.dat";
    ChStreamOutAsciiFile file_E(filename.c_str());
    file_E.SetNumFormat(numformat);
    StreamOUTsparseMatlabFormat(mdE, file_E);

    filename = path + "/" + prefix + "_f.dat";
    ChStreamOutAsciiFile file_f(filename.c_str());
    file_f.SetNumFormat(numformat);
    StreamOUTdenseMatlabFormat(mdf, file_f);

    filename = path + "/" + prefix + "_b.dat";
    ChStreamOutAsciiFile file_b(filename.c_str());
    file_b.SetNumFormat(numformat);
    StreamOUTdenseMatlabFormat(mdb, file_b);

    filename = path + "/" + prefix + "_fric.dat";
    ChStreamOutAsciiFile file_fric(filename.c_str());
    file_fric.SetNumFormat(numformat);
    StreamOUTdenseMatlabFormat(mdfric, file_fric);
}